

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O1

int __thiscall MPEG2StreamReader::processSeqStartCode(MPEG2StreamReader *this,uint8_t *buff)

{
  byte *pbVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  byte *nextNal;
  long lVar4;
  int iVar5;
  
  pbVar1 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  pbVar3 = buff + 2;
  do {
    nextNal = pbVar1;
    if (pbVar1 <= pbVar3) {
LAB_001be10f:
      iVar5 = -10;
      if (nextNal != pbVar1) {
        puVar2 = MPEGSequenceHeader::deserialize
                           (&this->m_sequence,buff + 1,(int64_t)(nextNal + ~(ulong)buff));
        if (puVar2 == (uint8_t *)0x0) {
          iVar5 = 3;
        }
        else {
          (this->super_MPEGStreamReader).m_streamAR = (uint)(this->m_sequence).aspect_ratio_info;
          iVar5 = 0;
          MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,(void *)0x0,buff,nextNal,0);
          this->spsFound = true;
          this->m_lastIFrame = true;
        }
      }
      return iVar5;
    }
    lVar4 = 3;
    if (*pbVar3 < 2) {
      if (*pbVar3 == 0) {
        lVar4 = 1;
      }
      else if ((pbVar3[-2] == 0) && (pbVar3[-1] == 0)) {
        nextNal = pbVar3 + -2;
        goto LAB_001be10f;
      }
    }
    pbVar3 = pbVar3 + lVar4;
  } while( true );
}

Assistant:

int MPEG2StreamReader::processSeqStartCode(uint8_t* buff)
{
    uint8_t* nextNal = MPEGHeader::findNextMarker(buff, m_bufEnd);
    if (nextNal == m_bufEnd)
    {
        return NOT_ENOUGH_BUFFER;
    }
    try
    {
        if (m_sequence.deserialize(buff + 1, nextNal - buff - 1) == nullptr)
            return NALUnit::UNSUPPORTED_PARAM;
        m_streamAR = static_cast<VideoAspectRatio>(m_sequence.aspect_ratio_info);
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
    constexpr int oldSpsLen = 0;
    updateFPS(nullptr, buff, nextNal, oldSpsLen);
    spsFound = true;
    m_lastIFrame = true;
    return 0;
}